

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_resorting(uint N_trials,uint list_size)

{
  ulong _N;
  int iVar1;
  time_t tVar2;
  int *data;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  sorted_ptr_arr<int> sorted_data;
  sorted_ptr_arr<int> local_40;
  
  _N = (ulong)list_size;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  data = (int *)operator_new__(_N * 4);
  if (list_size != 0) {
    uVar4 = 0;
    do {
      iVar1 = rand();
      data[uVar4] = (int)(((double)iVar1 * 100.0) / 2147483647.0);
      uVar4 = uVar4 + 1;
    } while (_N != uVar4);
  }
  local_40.ptr_arr = (smoothsort_ptr<int> *)0x0;
  local_40.N = _N;
  sorted_ptr_arr<int>::assign(&local_40,data,_N);
  sorted_ptr_arr<int>::sort(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sorting nearly-ordered list of ",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," integers ",10);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," times...",9);
  if (N_trials != 0) {
    uVar5 = 0;
    do {
      if (list_size != 0) {
        uVar4 = 0;
        do {
          iVar1 = rand();
          data[uVar4] = data[uVar4] + (int)(((double)iVar1 * 3.0) / 2147483647.0);
          uVar4 = uVar4 + 1;
        } while (_N != uVar4);
      }
      sorted_ptr_arr<int>::sort(&local_40);
      uVar5 = uVar5 + 1;
    } while (uVar5 != N_trials);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  operator_delete__(data);
  if (local_40.ptr_arr != (smoothsort_ptr<int> *)0x0) {
    operator_delete__(local_40.ptr_arr);
  }
  return;
}

Assistant:

void test_resorting(unsigned int N_trials, unsigned int list_size) {
	srand(time(NULL));
	
	int* test_input = new int[list_size];
	for(unsigned int i=0; i<list_size; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); }
	sorted_ptr_arr<int> sorted_data(&test_input[0], list_size);
	
	std::cout << "Sorting nearly-ordered list of " << list_size << " integers " << N_trials << " times..."; 
	for(unsigned int k=0; k<N_trials; k++) {
		for(unsigned int i=0; i<list_size; i++) { test_input[i] += (int)(3*(double)rand()/(double)RAND_MAX); }
		sorted_data.sort();
	}
	std::cout << "Done." << std::endl;
	
	delete[] test_input;
}